

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::CallI
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,ProfileId callSiteId,CallFlags callFlags)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  InlineCacheIndex local_3c;
  bool success_3;
  bool success_2;
  bool success_1;
  bool success;
  CacheIdUnit unit;
  ProfileId profileId2;
  ProfileId profileId;
  bool isCallWithICIndex;
  bool isProfiled2;
  OpLayoutType OStack_28;
  bool isProfiled;
  byte local_21;
  ProfileId local_20;
  ArgSlot local_1e;
  RegSlot RStack_1c;
  bool hasCallFlags;
  ProfileId callSiteId_local;
  ArgSlot givenArgCount_local;
  RegSlot functionRegister_local;
  RegSlot returnValueRegister_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  local_20 = callSiteId;
  local_1e = givenArgCount;
  RStack_1c = functionRegister;
  _callSiteId_local = returnValueRegister;
  functionRegister_local._2_2_ = op;
  _returnValueRegister_local = this;
  CheckOpen(this);
  op_00 = functionRegister_local._2_2_;
  local_21 = (callFlags == CallFlags_None ^ 0xffU) & 1;
  if (local_21 == 1) {
    OpLayoutType::OpLayoutType(&stack0xffffffffffffffd8,CallIFlags);
    CheckOp(this,op_00,OStack_28);
  }
  else {
    OpLayoutType::OpLayoutType((OpLayoutType *)&profileId2,CallI);
    CheckOp(this,op_00,_profileId2);
  }
  bVar2 = OpCodeAttr::HasMultiSizeLayout(functionRegister_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4e3,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (_callSiteId_local != 0xffffffff) {
    _callSiteId_local = ConsumeReg(this,_callSiteId_local);
  }
  RStack_1c = ConsumeReg(this,RStack_1c);
  unit._7_1_ = 0;
  unit._6_1_ = 0;
  unit._5_1_ = 0;
  unit.cacheId._2_2_ = local_20;
  unit.cacheId._0_2_ = 0xffff;
  CacheIdUnit::CacheIdUnit((CacheIdUnit *)&stack0xffffffffffffffc4);
  local_3c = 0xffffffff;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove
            (this->callRegToLdFldCacheIndexMap,&stack0xffffffffffffffe4,
             (CacheIdUnit *)&stack0xffffffffffffffc4);
  bVar2 = DoProfileCallOp(functionRegister_local._2_2_);
  if (bVar2) {
    bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((bVar2) && (local_20 != 0xffff)) {
      if (local_3c == 0xffffffff) {
        functionRegister_local._2_2_ =
             OpCodeUtil::ConvertCallOpToProfiled(functionRegister_local._2_2_,false);
      }
      else {
        unit._5_1_ = 1;
        functionRegister_local._2_2_ =
             OpCodeUtil::ConvertCallOpToProfiled(functionRegister_local._2_2_,true);
      }
      unit._7_1_ = 1;
    }
    else {
      bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
      if (((bVar2) || (bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false), bVar2)) &&
         (bVar2 = FunctionBody::AllocProfiledReturnTypeId
                            (this->m_functionWrite,(ProfileId *)((long)&unit.cacheId + 2)), bVar2))
      {
        functionRegister_local._2_2_ =
             OpCodeUtil::ConvertCallOpToProfiledReturnType(functionRegister_local._2_2_);
        unit._7_1_ = 1;
      }
    }
  }
  else {
    bVar2 = DoProfileNewScObjArrayOp(this,functionRegister_local._2_2_);
    if ((((bVar2) &&
         ((bVar2 = DoDynamicProfileOpcode(this,NativeArrayPhase,true), bVar2 ||
          (bVar2 = DoDynamicProfileOpcode(this,InlinePhase,true), bVar2)))) && (local_20 != 0xffff))
       && (bVar2 = FunctionBody::AllocProfiledArrayCallSiteId
                             (this->m_functionWrite,(ProfileId *)&unit), bVar2)) {
      OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&functionRegister_local + 2));
      unit._7_1_ = 1;
      unit._6_1_ = 1;
    }
    else {
      bVar2 = DoProfileNewScObjectOp(this,functionRegister_local._2_2_);
      if (((bVar2) &&
          ((bVar2 = DoDynamicProfileOpcode(this,InlinePhase,true), bVar2 ||
           (bVar2 = DoDynamicProfileOpcode(this,FixedNewObjPhase,true), bVar2)))) &&
         (local_20 != 0xffff)) {
        if (local_3c == 0xffffffff) {
          OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)((long)&functionRegister_local + 2));
        }
        else {
          unit._5_1_ = 1;
          OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex
                    ((OpCode *)((long)&functionRegister_local + 2));
        }
        unit._7_1_ = 1;
      }
    }
  }
  if ((unit._5_1_ & 1) == 0) {
    if ((local_21 & 1) == 1) {
      bVar2 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                         callFlags);
      if (((!bVar2) &&
          (bVar2 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                             (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e
                              ,callFlags), !bVar2)) &&
         (bVar2 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                            (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                             callFlags), !bVar2)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x534,"(success)","success");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
    else {
      bVar2 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                        (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e);
      if (((!bVar2) &&
          (bVar2 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                             (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e
                             ), !bVar2)) &&
         (bVar2 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                            (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e)
         , !bVar2)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x538,"(success)","success");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
  }
  else if ((local_21 & 1) == 1) {
    bVar2 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                       local_3c,(bool)(success_3 & 1),callFlags);
    if (((!bVar2) &&
        (bVar2 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                            local_3c,(bool)(success_3 & 1),callFlags), !bVar2)) &&
       (bVar2 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                           local_3c,(bool)(success_3 & 1),callFlags), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x529,"(success)","success");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  else {
    bVar2 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                       local_3c,(bool)(success_3 & 1));
    if (((!bVar2) &&
        (bVar2 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                            local_3c,(bool)(success_3 & 1)), !bVar2)) &&
       (bVar2 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,functionRegister_local._2_2_,_callSiteId_local,RStack_1c,local_1e,
                           local_3c,(bool)(success_3 & 1)), !bVar2)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x52d,"(success)","success");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
  }
  if (((unit._7_1_ & 1) != 0) &&
     (Data::Encode(&this->m_byteCodeData,(void *)((long)&unit.cacheId + 2),2), (unit._6_1_ & 1) != 0
     )) {
    Data::Encode(&this->m_byteCodeData,&unit,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::CallI(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();

        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags == true)
        {
            CheckOp(op, OpLayoutType::CallIFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallI);
        }

        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        bool isProfiled = false;
        bool isProfiled2 = false;
        bool isCallWithICIndex = false;
        ProfileId profileId = callSiteId;
        ProfileId profileId2 = Constants::NoProfileId;

        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);
        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
                {
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                }
                else
                {
                    isCallWithICIndex = true;
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op, true);
                }
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) &&
            (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            else
            {
                isCallWithICIndex = true;
                OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex(op);
            }
            isProfiled = true;
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlags, op, returnValueRegister, functionRegister, givenArgCount, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallI, op, returnValueRegister, functionRegister, givenArgCount);
            }
        }
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }